

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Entry * __thiscall
kj::
Table<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Entry,_kj::HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Callbacks>_>
::release(Entry *__return_storage_ptr__,
         Table<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Entry,_kj::HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Callbacks>_>
         *this,Entry *row)

{
  Entry *pEVar1;
  size_t pos;
  size_t oldPos;
  
  pos = ((long)row - (long)(this->rows).builder.ptr) / 0x50;
  Impl<0UL,_false>::erase(this,pos,row);
  HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Entry::Entry
            (__return_storage_ptr__,row);
  pEVar1 = (this->rows).builder.ptr;
  oldPos = ((long)(this->rows).builder.pos - (long)pEVar1) / 0x50 - 1;
  if (pos != oldPos) {
    Impl<0UL,_false>::move(this,oldPos,pos,pEVar1 + oldPos);
    HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Entry::operator=
              (row,(this->rows).builder.ptr + oldPos);
  }
  ArrayBuilder<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Entry>
  ::removeLast((ArrayBuilder<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Entry>
                *)this);
  return __return_storage_ptr__;
}

Assistant:

Row Table<Row, Indexes...>::release(Row& row) {
  KJ_TABLE_IREQUIRE(&row >= rows.begin() && &row < rows.end(), "row is not a member of this table");
  size_t pos = &row - rows.begin();
  Impl<>::erase(*this, pos, row);
  Row result = kj::mv(row);
  size_t back = rows.size() - 1;
  if (pos != back) {
    Impl<>::move(*this, back, pos, rows[back]);
    row = kj::mv(rows[back]);
  }
  rows.removeLast();
  return result;
}